

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

void lyd_validate_obsolete(lyd_node *node)

{
  lysc_node *plVar1;
  
  plVar1 = node->schema;
  do {
    if ((plVar1->flags & 0x10) != 0) {
      ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
      ly_log(plVar1->module->ctx,LY_LLWRN,LY_SUCCESS,
             "Obsolete schema node \"%s\" instantiated in data.",plVar1->name);
      ly_log_location_revert(0,1,0,0);
      return;
    }
    plVar1 = plVar1->parent;
  } while ((plVar1 != (lysc_node *)0x0) && ((plVar1->nodetype & 0x82) != 0));
  return;
}

Assistant:

static void
lyd_validate_obsolete(const struct lyd_node *node)
{
    const struct lysc_node *snode;

    snode = node->schema;
    do {
        if (snode->flags & LYS_STATUS_OBSLT) {
            LOG_LOCSET(NULL, node);
            LOGWRN(snode->module->ctx, "Obsolete schema node \"%s\" instantiated in data.", snode->name);
            LOG_LOCBACK(0, 1);
            break;
        }

        snode = snode->parent;
    } while (snode && (snode->nodetype & (LYS_CHOICE | LYS_CASE)));
}